

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

void dns_handler(mg_connection *nc,int ev,void *ev_data)

{
  size_t *psVar1;
  ushort uVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  uint16_t len;
  mg_dns_message msg;
  uint16_t local_c50;
  undefined2 uStack_c4e;
  ushort uStack_c4c;
  ushort uStack_c4a;
  undefined4 local_c48;
  mg_dns_message local_c40;
  
  (*nc->handler)(nc,ev,ev_data);
  if (ev == 3) {
    if (((nc->flags & 2) == 0) && (uVar3 = (nc->recv_mbuf).len, 1 < uVar3)) {
      pcVar4 = (nc->recv_mbuf).buf;
      memmove(pcVar4,pcVar4 + 2,uVar3 - 2);
      psVar1 = &(nc->recv_mbuf).len;
      *psVar1 = *psVar1 - 2;
    }
    iVar6 = mg_parse_dns((nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len,&local_c40);
    if (iVar6 == -1) {
      memset(&local_c40,0,0xc20);
      local_c40.flags = 0x8081;
      local_c48 = 0;
      _local_c50 = CONCAT26((ushort)local_c40.num_answers << 8 | (ushort)local_c40.num_answers >> 8,
                            CONCAT24((ushort)local_c40.num_questions << 8 |
                                     (ushort)local_c40.num_questions >> 8,
                                     CONCAT22(0x8180,local_c40.transaction_id)));
      mbuf_insert(&nc->recv_mbuf,0,&local_c50,0xc);
      if ((nc->flags & 2) == 0) {
        uVar2 = (ushort)(nc->recv_mbuf).len;
        _local_c50 = CONCAT62(_uStack_c4e,uVar2 << 8 | uVar2 >> 8);
        mbuf_insert(&nc->recv_mbuf,0,&local_c50,2);
      }
      mg_send(nc,(nc->recv_mbuf).buf,(int)(nc->recv_mbuf).len);
    }
    else {
      (*nc->handler)(nc,100,&local_c40);
    }
    uVar3 = (nc->recv_mbuf).len;
    if ((uVar3 != 0) && (uVar5 = (nc->recv_mbuf).len, uVar3 <= uVar5)) {
      pcVar4 = (nc->recv_mbuf).buf;
      memmove(pcVar4,pcVar4 + uVar3,uVar5 - uVar3);
      psVar1 = &(nc->recv_mbuf).len;
      *psVar1 = *psVar1 - uVar3;
    }
  }
  return;
}

Assistant:

static void dns_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct mbuf *io = &nc->recv_mbuf;
    struct mg_dns_message msg;

    /* Pass low-level events to the user handler */
    nc->handler(nc, ev, ev_data);

    switch (ev) {
        case MG_EV_RECV:
            if (!(nc->flags & MG_F_UDP)) {
                mbuf_remove(&nc->recv_mbuf, 2);
            }
            if (mg_parse_dns(nc->recv_mbuf.buf, nc->recv_mbuf.len, &msg) == -1) {
                /* reply + recursion allowed + format error */
                memset(&msg, 0, sizeof(msg));
                msg.flags = 0x8081;
                mg_dns_insert_header(io, 0, &msg);
                if (!(nc->flags & MG_F_UDP)) {
                    uint16_t len = htons(io->len);
                    mbuf_insert(io, 0, &len, 2);
                }
                mg_send(nc, io->buf, io->len);
            } else {
                /* Call user handler with parsed message */
                nc->handler(nc, MG_DNS_MESSAGE, &msg);
            }
            mbuf_remove(io, io->len);
            break;
    }
}